

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O1

ssize_t __thiscall
psy::C::SyntaxWriterDOTFormat::write(SyntaxWriterDOTFormat *this,int __fd,void *__buf,size_t __n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *__buf_00;
  string basename;
  ofstream ofs;
  string local_240;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  SyntaxTree::filePath_abi_cxx11_(&local_240,(this->super_SyntaxDumper).super_SyntaxVisitor.tree_);
  std::__cxx11::string::_M_append((char *)&local_240,*__buf);
  std::ofstream::ofstream(&local_220,(string *)&local_240,_S_out);
  write(this,__fd,__buf_00,(size_t)&local_220);
  std::ofstream::close();
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  paVar1 = &local_240.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar1) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    paVar1 = extraout_RAX;
  }
  return (ssize_t)paVar1;
}

Assistant:

void SyntaxWriterDOTFormat::write(const SyntaxNode* node,
                                  const std::string& fileSuffix)
{
    std::string basename = tree_->filePath();
    basename.append(fileSuffix);
    std::ofstream ofs(basename);
    write(node, fileSuffix, ofs);
    ofs.close();
}